

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

void check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,char_const*>
               (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *a,char *b)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffea18;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffea20;
  string local_1398 [32];
  ostringstream local_1378 [383];
  undefined1 local_11f9;
  string local_11f8 [32];
  ostringstream local_11d8 [383];
  undefined1 local_1059;
  string local_1058 [32];
  ostringstream local_1038 [383];
  undefined1 local_eb9;
  string local_eb8 [32];
  ostringstream local_e98 [383];
  undefined1 local_d19;
  string local_d18 [32];
  ostringstream local_cf8 [383];
  undefined1 local_b79;
  string local_b78 [32];
  ostringstream local_b58 [383];
  undefined1 local_9d9;
  string local_9d8 [32];
  ostringstream local_9b8 [383];
  undefined1 local_839;
  string local_838 [32];
  ostringstream local_818 [383];
  undefined1 local_699;
  string local_698 [32];
  ostringstream local_678 [383];
  undefined1 local_4f9;
  string local_4f8 [32];
  ostringstream local_4d8 [383];
  undefined1 local_359;
  string local_358 [32];
  ostringstream local_338 [383];
  undefined1 local_1b9;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  bVar1 = booster::operator<(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar2 = std::operator<<((ostream *)local_188,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
    std::operator<<(poVar2," a<b");
    local_1b9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1b8);
    local_1b9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<=(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_338);
    poVar2 = std::operator<<((ostream *)local_338,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f);
    std::operator<<(poVar2," a<=b");
    local_359 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_358);
    local_359 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4d8);
    poVar2 = std::operator<<((ostream *)local_4d8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
    std::operator<<(poVar2," !(a>b)");
    local_4f9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_4f8);
    local_4f9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>=(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_678);
    poVar2 = std::operator<<((ostream *)local_678,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x31);
    std::operator<<(poVar2," !(a>=b)");
    local_699 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_698);
    local_699 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_818);
    poVar2 = std::operator<<((ostream *)local_818,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    std::operator<<(poVar2," b>a");
    local_839 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_838);
    local_839 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>=((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_9b8);
    poVar2 = std::operator<<((ostream *)local_9b8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    std::operator<<(poVar2," b>=a");
    local_9d9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_9d8);
    local_9d9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_b58);
    poVar2 = std::operator<<((ostream *)local_b58,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x34);
    std::operator<<(poVar2," !(b<a)");
    local_b79 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_b78);
    local_b79 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<=((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  if (!bVar1) {
    bVar1 = booster::operator!=(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_e98);
      poVar2 = std::operator<<((ostream *)local_e98,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
      std::operator<<(poVar2," a!=b");
      local_eb9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_eb8);
      local_eb9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator!=((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1038);
      poVar2 = std::operator<<((ostream *)local_1038,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
      std::operator<<(poVar2," b!=a");
      local_1059 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_1058);
      local_1059 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator==(in_stack_ffffffffffffea20,(value_type *)in_stack_ffffffffffffea18);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_11d8);
      poVar2 = std::operator<<((ostream *)local_11d8,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
      std::operator<<(poVar2," !(a==b)");
      local_11f9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_11f8);
      local_11f9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator==((value_type *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
    if (!bVar1) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1378);
    poVar2 = std::operator<<((ostream *)local_1378,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x39);
    std::operator<<(poVar2," !(b==a)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1398);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_cf8);
  poVar2 = std::operator<<((ostream *)local_cf8,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
  std::operator<<(poVar2," !(b<=a)");
  local_d19 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_d18);
  local_d19 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_less(Match const &a,Other b)
{
	TEST(a<b);
	TEST(a<=b);
	TEST(!(a>b));
	TEST(!(a>=b));
	TEST(b>a);
	TEST(b>=a);
	TEST(!(b<a));
	TEST(!(b<=a));
	TEST(a!=b);
	TEST(b!=a);
	TEST(!(a==b));
	TEST(!(b==a));
}